

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_func_queue_examples.cpp
# Opt level: O2

void density_tests::
     LfFunctionQueueSamples<(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
     ::func_queue_try_put_samples(ostream *i_ostream)

{
  bool bVar1;
  value_type *pvVar2;
  undefined8 *puVar3;
  void *pvVar4;
  put_transaction<typename_std::decay<Func>::type> transaction;
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  queue;
  PrintScopeDuration dur;
  put_transaction<Func> local_160;
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  local_140;
  Func_conflict local_c0;
  put_transaction<typename_std::decay<Func>::type> local_b0;
  PrintScopeDuration local_90 [2];
  
  PrintScopeDuration::PrintScopeDuration(local_90,i_ostream,"lock-free function queue put samples");
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  .m_tail.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0xffc0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  .m_head = (ControlBlock *)0x0;
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::
  try_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::_lambda()_1_,density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::_lambda()_1_>
            ((lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)&local_140,progress_lock_free,(anon_class_1_0_00000001 *)&local_160);
  do {
    bVar1 = density::
            lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::try_consume_impl(&local_140);
  } while (bVar1);
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_140.m_queue);
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  .m_tail.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0xffc0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  .m_head = (ControlBlock *)0x0;
  local_160.m_put.m_control_block =
       (LfQueueControl *)CONCAT44(local_160.m_put.m_control_block._4_4_,7);
  bVar1 = density::
          lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
          ::
          try_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func,int>
                    ((lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
                      *)&local_140,progress_lock_free,(int *)&local_160);
  if (bVar1) {
    bVar1 = density::
            lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::try_consume_impl(&local_140);
    if (!bVar1) {
      __assert_fail("invoked",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_func_queue_examples.cpp"
                    ,0x121,
                    "static void density_tests::LfFunctionQueueSamples<density::function_standard_erasure, density::concurrency_multiple, density::concurrency_single, density::consistency_sequential>::func_queue_try_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
  }
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_140.m_queue);
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  .m_tail.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0xffc0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  .m_head = (ControlBlock *)0x0;
  local_c0.m_string_1 = (char *)0x0;
  local_c0.m_string_2 = (char *)0x0;
  density::
  lf_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::
  try_start_push<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func>
            (&local_b0,&local_140,progress_lock_free,&local_c0);
  local_160.m_put.m_control_block = local_b0.m_put.m_control_block;
  local_160.m_put.m_next_ptr = local_b0.m_put.m_next_ptr;
  local_160.m_put.m_user_storage = local_b0.m_put.m_user_storage;
  local_160.m_queue = local_b0.m_queue;
  local_b0.m_put.m_user_storage = (void *)0x0;
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<Func>::~put_transaction(&local_b0);
  if (local_160.m_put.m_user_storage != (void *)0x0) {
    pvVar2 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::raw_allocate_copy<char[12]>
                       (&local_160,(char (*) [12])"Hello world");
    puVar3 = (undefined8 *)
             density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::element_ptr(&local_160);
    *puVar3 = pvVar2;
    pvVar2 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::raw_allocate_copy<char[18]>
                       (&local_160,(char (*) [18])"\t(I\'m so happy)!!");
    pvVar4 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::element_ptr(&local_160);
    *(value_type **)((long)pvVar4 + 8) = pvVar2;
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::put_transaction<Func>::commit(&local_160);
    bVar1 = density::
            lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::try_consume_impl(&local_140);
    if (!bVar1) {
      __assert_fail("invoked",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_func_queue_examples.cpp"
                    ,0x148,
                    "static void density_tests::LfFunctionQueueSamples<density::function_standard_erasure, density::concurrency_multiple, density::concurrency_single, density::consistency_sequential>::func_queue_try_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
  }
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<Func>::~put_transaction(&local_160);
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_140.m_queue);
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  .m_tail.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0xffc0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  .m_head = (ControlBlock *)0x0;
  density::
  lf_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::
  try_start_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func>
            (&local_b0,&local_140,progress_lock_free);
  local_160.m_put.m_control_block = local_b0.m_put.m_control_block;
  local_160.m_put.m_next_ptr = local_b0.m_put.m_next_ptr;
  local_160.m_put.m_user_storage = local_b0.m_put.m_user_storage;
  local_160.m_queue = local_b0.m_queue;
  local_b0.m_put.m_user_storage = (void *)0x0;
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<Func>::~put_transaction(&local_b0);
  if (local_160.m_put.m_user_storage != (void *)0x0) {
    pvVar2 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::raw_allocate_copy<char[12]>
                       (&local_160,(char (*) [12])"Hello world");
    puVar3 = (undefined8 *)
             density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::element_ptr(&local_160);
    *puVar3 = pvVar2;
    pvVar2 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::raw_allocate_copy<char[18]>
                       (&local_160,(char (*) [18])"\t(I\'m so happy)!!");
    pvVar4 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::put_transaction<Func>::element_ptr(&local_160);
    *(value_type **)((long)pvVar4 + 8) = pvVar2;
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::put_transaction<Func>::commit(&local_160);
    bVar1 = density::
            lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::try_consume_impl(&local_140);
    if (!bVar1) {
      __assert_fail("invoked",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_func_queue_examples.cpp"
                    ,0x16e,
                    "static void density_tests::LfFunctionQueueSamples<density::function_standard_erasure, density::concurrency_multiple, density::concurrency_single, density::consistency_sequential>::func_queue_try_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
  }
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<Func>::~put_transaction(&local_160);
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_140.m_queue);
  PrintScopeDuration::~PrintScopeDuration(local_90);
  return;
}

Assistant:

static void func_queue_try_put_samples(std::ostream & i_ostream)
        {
            PrintScopeDuration dur(i_ostream, "lock-free function queue put samples");

            using namespace density;

            {
                //! [lf_function_queue try_push example 1]
                lf_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>
                  queue;

                bool const ok =
                  queue.try_push(progress_lock_free, [] { std::cout << "Hello world!"; });

                while (queue.try_consume())
                    ;
                //! [lf_function_queue try_push example 1]
                (void)ok;
            }
            {
                //! [lf_function_queue try_emplace example 1]
                /* This local struct is unmovable and uncopyable, so emplace is the only
                    option to add it to the queue. Note that operator () returns an int,
                    but we add it to a void() function queue. This is ok, as we are just
                    discarding the return value. */
                struct Func
                {
                    int const m_value;

                    Func(int i_value) : m_value(i_value) {}

                    Func(const Func &) = delete;
                    Func & operator=(const Func &) = delete;

                    int operator()() const
                    {
                        std::cout << m_value << std::endl;
                        return m_value;
                    }
                };

                lf_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>
                     queue;
                bool invoked = false;
                if (queue.template try_emplace<Func>(progress_lock_free, 7))
                {
                    invoked = queue.try_consume();
                    assert(invoked);
                }
                //! [lf_function_queue try_emplace example 1]
                (void)invoked;
            }
            {
                //! [lf_function_queue try_start_push example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                lf_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>
                  queue;

                bool invoked = false;
                if (auto transaction = queue.try_start_push(progress_lock_free, Func{}))
                {
                    // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                    transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                    transaction.element().m_string_2 =
                      transaction.raw_allocate_copy("\t(I'm so happy)!!");

                    transaction.commit();

                    invoked = queue.try_consume();
                    assert(invoked);
                }
                //! [lf_function_queue try_start_push example 1]
                (void)invoked;
            }
            {
                //! [lf_function_queue try_start_emplace example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                lf_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>
                     queue;
                bool invoked = false;
                if (auto transaction = queue.template try_start_emplace<Func>(progress_lock_free))
                {
                    // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                    transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                    transaction.element().m_string_2 =
                      transaction.raw_allocate_copy("\t(I'm so happy)!!");

                    transaction.commit();

                    invoked = queue.try_consume();
                    assert(invoked);
                }
                //! [lf_function_queue try_start_emplace example 1]
                (void)invoked;
            }
        }